

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

PackageImportItemSyntax * __thiscall slang::parsing::Parser::parsePackageImportItem(Parser *this)

{
  bool bVar1;
  PackageImportItemSyntax *pPVar2;
  Token package;
  Token doubleColon;
  Token local_38;
  
  package = ParserBase::expect(&this->super_ParserBase,Identifier);
  doubleColon = ParserBase::expect(&this->super_ParserBase,DoubleColon);
  Token::Token(&local_38);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Star);
  if (bVar1) {
    local_38 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    local_38 = ParserBase::expect(&this->super_ParserBase,Identifier);
  }
  pPVar2 = slang::syntax::SyntaxFactory::packageImportItem
                     (&this->factory,package,doubleColon,local_38);
  return pPVar2;
}

Assistant:

PackageImportItemSyntax& Parser::parsePackageImportItem() {
    auto package = expect(TokenKind::Identifier);
    auto doubleColon = expect(TokenKind::DoubleColon);

    Token item;
    if (peek(TokenKind::Star))
        item = consume();
    else
        item = expect(TokenKind::Identifier);

    return factory.packageImportItem(package, doubleColon, item);
}